

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawData::ScaleClipRects(ImDrawData *this,ImVec2 *fb_scale)

{
  ImDrawList *this_00;
  ImDrawCmd *pIVar1;
  int cmd_i;
  int i_00;
  int i;
  long lVar2;
  ImVec4 IVar4;
  float fVar3;
  float fVar5;
  
  for (lVar2 = 0; lVar2 < this->CmdListsCount; lVar2 = lVar2 + 1) {
    this_00 = this->CmdLists[lVar2];
    for (i_00 = 0; i_00 < (this_00->CmdBuffer).Size; i_00 = i_00 + 1) {
      pIVar1 = ImVector<ImDrawCmd>::operator[](&this_00->CmdBuffer,i_00);
      fVar3 = (*fb_scale).x;
      IVar4.x = fVar3 * (pIVar1->ClipRect).x;
      fVar5 = (*fb_scale).y;
      IVar4.y = fVar5 * (pIVar1->ClipRect).y;
      IVar4.z = fVar3 * (pIVar1->ClipRect).z;
      IVar4.w = fVar5 * (pIVar1->ClipRect).w;
      pIVar1->ClipRect = IVar4;
    }
  }
  return;
}

Assistant:

void ImDrawData::ScaleClipRects(const ImVec2& fb_scale)
{
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            ImDrawCmd* cmd = &cmd_list->CmdBuffer[cmd_i];
            cmd->ClipRect = ImVec4(cmd->ClipRect.x * fb_scale.x, cmd->ClipRect.y * fb_scale.y, cmd->ClipRect.z * fb_scale.x, cmd->ClipRect.w * fb_scale.y);
        }
    }
}